

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case2357(ParserTester *this)

{
  Expectation *pEVar1;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"default : x ;",&local_1b9);
  Expectation::Expectation(&local_178);
  std::__cxx11::string::string
            ((string *)&local_1b8,
             (string *)
             &Parser::DiagnosticsReporter::ID_of_UnexpectedDefaultLabelOutsideSwitch_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_178,Error,&local_1b8);
  Expectation::Expectation(&local_c0,pEVar1);
  parseStatement(this,&local_198,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_1b8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void ParserTester::case2357()
{
    parseStatement("default : x ;",
                   Expectation().diagnostic(Expectation::ErrorOrWarn::Error,
                                               Parser::DiagnosticsReporter::ID_of_UnexpectedDefaultLabelOutsideSwitch));
}